

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

int decompose(int n,int *ifac,int *ntryh)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  
  lVar7 = 0;
  lVar3 = 0;
  iVar5 = n;
  do {
    iVar1 = ntryh[lVar7];
    iVar2 = (int)lVar3;
    if (iVar1 == 0) {
      *ifac = n;
      ifac[1] = iVar2;
      return iVar2;
    }
    piVar8 = ifac + (long)iVar2 + 2;
    lVar3 = (long)iVar2;
    while (iVar5 != 1) {
      if (iVar5 != (iVar5 / iVar1) * iVar1) break;
      ifac[lVar3 + 2] = iVar1;
      if (lVar3 != 0 && iVar1 == 2) {
        piVar6 = piVar8;
        for (lVar4 = 2; lVar4 <= lVar3 + 1; lVar4 = lVar4 + 1) {
          *piVar6 = piVar6[-1];
          piVar6 = piVar6 + -1;
        }
        ifac[2] = 2;
      }
      piVar8 = piVar8 + 1;
      lVar3 = lVar3 + 1;
      iVar5 = iVar5 / iVar1;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static int decompose(int n, int *ifac, const int *ntryh) {
  int nl = n, nf = 0, i, j = 0;
  for (j=0; ntryh[j]; ++j) {
    int ntry = ntryh[j];
    while (nl != 1) {
      int nq = nl / ntry;
      int nr = nl - ntry * nq;
      if (nr == 0) {
        ifac[2+nf++] = ntry;
        nl = nq;
        if (ntry == 2 && nf != 1) {
          for (i = 2; i <= nf; ++i) {
            int ib = nf - i + 2;
            ifac[ib + 1] = ifac[ib];
          }
          ifac[2] = 2;
        }
      } else break;
    }
  }
  ifac[0] = n;
  ifac[1] = nf;  
  return nf;
}